

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O2

void __thiscall Histogram::Histogram(Histogram *this,Histogram *src)

{
  HistBin *pHVar1;
  
  pHVar1 = (HistBin *)operator_new__(0x208);
  this->bins = pHVar1;
  operator=(this,src);
  return;
}

Assistant:

Histogram(const Histogram& src) {
        bins = new HistBin[MAX_BINS];
        // It will invoke `operator=()` below.
        *this = src;
    }